

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCompositeInertia.cpp
# Opt level: O2

void __thiscall
chrono::utils::CompositeInertia::AddComponent
          (CompositeInertia *this,ChFrame<double> *frame,double mass,ChMatrix33<double> *inertia,
          bool is_void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined7 in_register_00000009;
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ChMatrix33<double> increment;
  double local_128;
  PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> local_120 [72];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
  local_d8;
  ChMatrix33<double> *local_b8;
  ChMatrix33<double> *local_b0;
  ChMatrix33<double> *local_a8;
  LhsNested local_a0;
  double local_90;
  MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> local_78 [72];
  
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = mass;
  dVar1 = this->m_mass;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  dVar5 = (double)((ulong)is_void * -0x4010000000000000 + (ulong)!is_void * 0x3ff0000000000000);
  dVar3 = dVar5 * mass;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5;
  auVar6 = vfmadd213sd_fma(auVar8._0_16_,auVar10,auVar11);
  dVar5 = (frame->coord).pos.m_data[2];
  dVar2 = (this->m_com).m_data[2];
  dVar7 = (frame->coord).pos.m_data[1];
  dVar9 = 1.0 / auVar6._0_8_;
  auVar4 = vunpcklpd_avx(*(undefined1 (*) [16])(this->m_com).m_data,auVar11);
  auVar10 = vmovhpd_avx(auVar11,(this->m_com).m_data[1]);
  (this->m_com).m_data[0] =
       dVar9 * (auVar4._0_8_ * auVar10._0_8_ + dVar3 * (frame->coord).pos.m_data[0]);
  (this->m_com).m_data[1] = dVar9 * (auVar4._8_8_ * auVar10._8_8_ + dVar3 * dVar7);
  (this->m_com).m_data[2] = dVar9 * (dVar1 * dVar2 + dVar3 * dVar5);
  this->m_mass = auVar6._0_8_;
  local_128 = mass;
  InertiaShiftMatrix(&(frame->coord).pos);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*(&local_d8,local_78,&local_128);
  local_a0 = local_d8.m_lhs;
  local_90 = local_d8.m_rhs.m_functor.m_other;
  local_b8 = &frame->Amatrix;
  local_b0 = inertia;
  local_a8 = &frame->Amatrix;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>const>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
            (local_120,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>_>
              *)&local_b8);
  if ((int)CONCAT71(in_register_00000009,is_void) == 0) {
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)this,
               (MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_120);
  }
  else {
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator-=
              ((MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)this,
               (MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_120);
  }
  return;
}

Assistant:

void CompositeInertia::AddComponent(
    const ChFrame<>& frame,       // centroidal frame of sub-component
    double mass,                  // mass of sub-component
    const ChMatrix33<>& inertia,  // sub-component inertia tensor w.r.t. its centroidal frame
    bool is_void                  // indicate if sub-component represents a material void
    ) {
    const ChVector<>& com = frame.GetPos();
    const ChMatrix33<>& A = frame.GetA();

    double sign = is_void ? -1 : +1;

    // Update location of composite COM
    m_com = (m_mass * m_com + sign * mass * com) / (m_mass + sign * mass);

    // Update composite mass
    m_mass = m_mass + sign * mass;

    // Express sub-component inertia w.r.t. the reference frame and update composite inertia
    ChMatrix33<> increment = A * inertia * A.transpose() + InertiaShiftMatrix(com) * mass;
    if (is_void)
        m_inertia -= increment;
    else
        m_inertia += increment;
}